

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcol.c
# Opt level: O0

int ffgpxfll(fitsfile *fptr,int datatype,LONGLONG *firstpix,LONGLONG nelem,void *array,
            char *nullarray,int *anynul,int *status)

{
  int iVar1;
  long local_b8;
  LONGLONG firstelem;
  LONGLONG dimsize;
  LONGLONG naxes [9];
  int local_50;
  int nullcheck;
  int ii;
  int naxis;
  char *nullarray_local;
  void *array_local;
  LONGLONG nelem_local;
  LONGLONG *firstpix_local;
  fitsfile *pfStack_20;
  int datatype_local;
  fitsfile *fptr_local;
  
  firstelem = 1;
  if ((*status < 1) && (nelem != 0)) {
    _ii = nullarray;
    nullarray_local = (char *)array;
    array_local = (void *)nelem;
    nelem_local = (LONGLONG)firstpix;
    firstpix_local._4_4_ = datatype;
    pfStack_20 = fptr;
    ffgidm(fptr,&nullcheck,status);
    ffgiszll(pfStack_20,9,&dimsize,status);
    local_b8 = 0;
    for (local_50 = 0; local_50 < nullcheck; local_50 = local_50 + 1) {
      local_b8 = (*(long *)(nelem_local + (long)local_50 * 8) + -1) * firstelem + local_b8;
      firstelem = naxes[(long)local_50 + -1] * firstelem;
    }
    local_b8 = local_b8 + 1;
    iVar1 = fits_is_compressed_image(pfStack_20,status);
    if (iVar1 == 0) {
      if (firstpix_local._4_4_ == 0xb) {
        ffgclb(pfStack_20,2,1,local_b8,(LONGLONG)array_local,1,2,'\0',(uchar *)nullarray_local,_ii,
               anynul,status);
      }
      else if (firstpix_local._4_4_ == 0xc) {
        ffgclsb(pfStack_20,2,1,local_b8,(LONGLONG)array_local,1,2,'\0',nullarray_local,_ii,anynul,
                status);
      }
      else if (firstpix_local._4_4_ == 0x14) {
        ffgclui(pfStack_20,2,1,local_b8,(LONGLONG)array_local,1,2,0,
                (unsigned_short *)nullarray_local,_ii,anynul,status);
      }
      else if (firstpix_local._4_4_ == 0x15) {
        ffgcli(pfStack_20,2,1,local_b8,(LONGLONG)array_local,1,2,0,(short *)nullarray_local,_ii,
               anynul,status);
      }
      else if (firstpix_local._4_4_ == 0x1e) {
        ffgcluk(pfStack_20,2,1,local_b8,(LONGLONG)array_local,1,2,0,(uint *)nullarray_local,_ii,
                anynul,status);
      }
      else if (firstpix_local._4_4_ == 0x1f) {
        ffgclk(pfStack_20,2,1,local_b8,(LONGLONG)array_local,1,2,0,(int *)nullarray_local,_ii,anynul
               ,status);
      }
      else if (firstpix_local._4_4_ == 0x28) {
        ffgcluj(pfStack_20,2,1,local_b8,(LONGLONG)array_local,1,2,0,(unsigned_long *)nullarray_local
                ,_ii,anynul,status);
      }
      else if (firstpix_local._4_4_ == 0x29) {
        ffgclj(pfStack_20,2,1,local_b8,(LONGLONG)array_local,1,2,0,(long *)nullarray_local,_ii,
               anynul,status);
      }
      else if (firstpix_local._4_4_ == 0x50) {
        ffgclujj(pfStack_20,2,1,local_b8,(LONGLONG)array_local,1,2,0,(ULONGLONG *)nullarray_local,
                 _ii,anynul,status);
      }
      else if (firstpix_local._4_4_ == 0x51) {
        ffgcljj(pfStack_20,2,1,local_b8,(LONGLONG)array_local,1,2,0,(LONGLONG *)nullarray_local,_ii,
                anynul,status);
      }
      else if (firstpix_local._4_4_ == 0x2a) {
        ffgcle(pfStack_20,2,1,local_b8,(LONGLONG)array_local,1,2,0.0,(float *)nullarray_local,_ii,
               anynul,status);
      }
      else if (firstpix_local._4_4_ == 0x52) {
        ffgcld(pfStack_20,2,1,local_b8,(LONGLONG)array_local,1,2,0.0,(double *)nullarray_local,_ii,
               anynul,status);
      }
      else {
        *status = 0x19a;
      }
      fptr_local._4_4_ = *status;
    }
    else {
      fits_read_compressed_pixels
                (pfStack_20,firstpix_local._4_4_,local_b8,(LONGLONG)array_local,2,(void *)0x0,
                 nullarray_local,_ii,anynul,status);
      fptr_local._4_4_ = *status;
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffgpxfll( fitsfile *fptr, /* I - FITS file pointer                       */
            int  datatype,    /* I - datatype of the value                   */
            LONGLONG *firstpix, /* I - coord of first pixel to read (1s based) */
            LONGLONG nelem,       /* I - number of values to read              */
            void *array,      /* O - array of values that are returned       */
            char *nullarray,  /* O - returned array of null value flags      */
            int  *anynul,     /* O - set to 1 if any values are null; else 0 */
            int  *status)     /* IO - error status                           */
/*
  Read an array of values from the primary array. The datatype of the
  input array is defined by the 2nd argument.  Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of
  the FITS array is not the same as the array being read).
  The nullarray values will = 1 if the corresponding array value is null.
  ANYNUL is returned with a value of .true. if any pixels are undefined.
*/
{
    int naxis, ii;
    int nullcheck = 2;
    LONGLONG naxes[9];
    LONGLONG dimsize = 1, firstelem;

    if (*status > 0 || nelem == 0)   /* inherit input status value if > 0 */
        return(*status);

    /* get the size of the image */
    ffgidm(fptr, &naxis, status);
    ffgiszll(fptr, 9, naxes, status);

    /* calculate the position of the first element in the array */
    firstelem = 0;
    for (ii=0; ii < naxis; ii++)
    {
        firstelem += ((firstpix[ii] - 1) * dimsize);
        dimsize *= naxes[ii];
    }
    firstelem++;

    if (fits_is_compressed_image(fptr, status))
    {
        /* this is a compressed image in a binary table */

        fits_read_compressed_pixels(fptr, datatype, firstelem, nelem,
            nullcheck, NULL, array, nullarray, anynul, status);
        return(*status);
    }

    /*
      the primary array is represented as a binary table:
      each group of the primary array is a row in the table,
      where the first column contains the group parameters
      and the second column contains the image itself.
    */

    if (datatype == TBYTE)
    {
        ffgclb(fptr, 2, 1, firstelem, nelem, 1, 2, 0,
               (unsigned char *) array, nullarray, anynul, status);
    }
    else if (datatype == TSBYTE)
    {
        ffgclsb(fptr, 2, 1, firstelem, nelem, 1, 2, 0,
               (signed char *) array, nullarray, anynul, status);
    }
    else if (datatype == TUSHORT)
    {
        ffgclui(fptr, 2, 1, firstelem, nelem, 1, 2, 0,
               (unsigned short *) array, nullarray, anynul, status);
    }
    else if (datatype == TSHORT)
    {
        ffgcli(fptr, 2, 1, firstelem, nelem, 1, 2, 0,
               (short *) array, nullarray, anynul, status);
    }
    else if (datatype == TUINT)
    {
        ffgcluk(fptr, 2, 1, firstelem, nelem, 1, 2, 0,
               (unsigned int *) array, nullarray, anynul, status);
    }
    else if (datatype == TINT)
    {
        ffgclk(fptr, 2, 1, firstelem, nelem, 1, 2, 0,
               (int *) array, nullarray, anynul, status);
    }
    else if (datatype == TULONG)
    {
        ffgcluj(fptr, 2, 1, firstelem, nelem, 1, 2, 0,
               (unsigned long *) array, nullarray, anynul, status);
    }
    else if (datatype == TLONG)
    {
        ffgclj(fptr, 2, 1, firstelem, nelem, 1, 2, 0,
               (long *) array, nullarray, anynul, status);
    }
    else if (datatype == TULONGLONG)
    {
        ffgclujj(fptr, 2, 1, firstelem, nelem, 1, 2, 0,
               (ULONGLONG *) array, nullarray, anynul, status);
    }
    else if (datatype == TLONGLONG)
    {
        ffgcljj(fptr, 2, 1, firstelem, nelem, 1, 2, 0,
               (LONGLONG *) array, nullarray, anynul, status);
    }
    else if (datatype == TFLOAT)
    {
        ffgcle(fptr, 2, 1, firstelem, nelem, 1, 2, 0,
               (float *) array, nullarray, anynul, status);
    }
    else if (datatype == TDOUBLE)
    {
        ffgcld(fptr, 2, 1, firstelem, nelem, 1, 2, 0,
               (double *) array, nullarray, anynul, status);
    }
    else
      *status = BAD_DATATYPE;

    return(*status);
}